

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput.cpp
# Opt level: O3

Layer * ncnn::Yolov3DetectionOutput_layer_creator(void)

{
  Yolov3DetectionOutput *this;
  
  this = (Yolov3DetectionOutput *)operator_new(0x198);
  Yolov3DetectionOutput::Yolov3DetectionOutput(this);
  return &this->super_Layer;
}

Assistant:

Yolov3DetectionOutput::Yolov3DetectionOutput()
{
    one_blob_only = false;
    support_inplace = false;
    
    //softmax = ncnn::create_layer(ncnn::LayerType::Softmax);

    // set param
    ncnn::ParamDict pd;
    pd.set(0, 0);// axis

    //softmax->load_param(pd);
}